

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauProxy.cpp
# Opt level: O0

void __thiscall mau::ProxySession::postNextTimer(ProxySession *this)

{
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *in_RDI;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffffe0;
  duration *in_stack_ffffffffffffffe8;
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *in_stack_fffffffffffffff0;
  
  std::
  unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
  ::operator->((unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
                *)0x10ddbf);
  std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<unsigned_int,void>
            ((duration<long,std::ratio<1l,1000000l>> *)&stack0xffffffffffffffe8,
             &postNextTimer::kTickIntervalUsec);
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::
  duration<long,std::ratio<1l,1000000l>,void>
            (in_stack_ffffffffffffffe0,(duration<long,_std::ratio<1L,_1000000L>_> *)in_RDI);
  asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  ::expires_after(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  std::
  unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
  ::operator->((unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
                *)0x10de04);
  asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::waitable_timer_service<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
  ::async_wait<mau::ProxySession::postNextTimer()::__0>(in_RDI,(anon_class_8_1_8991fb9c *)in_RDI);
  return;
}

Assistant:

void ProxySession::postNextTimer()
{
    static const unsigned kTickIntervalUsec = 1000 * 1000; /// 1 second
    Ticker->expires_after(std::chrono::microseconds(kTickIntervalUsec));

    Ticker->async_wait(([this](const asio::error_code& error)
    {
        if (!error)
        {
            onTick();
            postNextTimer();
        }
    }));
}